

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::flattened_access_chain_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t base,uint32_t *indices,
          uint32_t count,SPIRType *target_type,uint32_t offset,uint32_t matrix_stride,
          uint32_t param_7,bool need_transpose)

{
  CompilerError *this_00;
  allocator local_39;
  string local_38;
  
  if ((target_type->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Access chains that result in an array can not be flattened",
               &local_39);
    CompilerError::CompilerError(this_00,&local_38);
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (*(int *)&(target_type->super_IVariant).field_0xc == 0xf) {
    flattened_access_chain_struct_abi_cxx11_
              (__return_storage_ptr__,this,base,indices,count,target_type,offset);
  }
  else if (target_type->columns < 2) {
    flattened_access_chain_vector_abi_cxx11_
              (__return_storage_ptr__,this,base,indices,count,target_type,offset,matrix_stride,
               need_transpose);
  }
  else {
    flattened_access_chain_matrix_abi_cxx11_
              (__return_storage_ptr__,this,base,indices,count,target_type,offset,matrix_stride,
               need_transpose);
  }
  return __return_storage_ptr__;
}

Assistant:

static bool packing_has_flexible_offset(BufferPackingStandard packing)
{
	switch (packing)
	{
	case BufferPackingStd140:
	case BufferPackingStd430:
	case BufferPackingScalar:
	case BufferPackingHLSLCbuffer:
		return false;

	default:
		return true;
	}
}